

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O2

Tensor * __thiscall cnn::Tensor::batch_elem(Tensor *__return_storage_ptr__,Tensor *this,uint b)

{
  float *pfVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint uVar5;
  
  uVar5 = (this->d).bd;
  if (uVar5 == 1) {
    Tensor(__return_storage_ptr__,this);
  }
  else {
    if (uVar5 <= b) {
      __assert_fail("b < d.batch_elems()",
                    "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/tensor.h"
                    ,0x6c,"Tensor cnn::Tensor::batch_elem(unsigned int) const");
    }
    uVar5 = Dim::batch_size(&this->d);
    uVar2 = *(undefined8 *)((this->d).d + 2);
    uVar3 = *(undefined8 *)((this->d).d + 4);
    uVar4 = *(undefined8 *)((this->d).d + 6);
    *(undefined8 *)(__return_storage_ptr__->d).d = *(undefined8 *)(this->d).d;
    *(undefined8 *)((__return_storage_ptr__->d).d + 2) = uVar2;
    *(undefined8 *)((__return_storage_ptr__->d).d + 4) = uVar3;
    *(undefined8 *)((__return_storage_ptr__->d).d + 6) = uVar4;
    pfVar1 = this->v;
    (__return_storage_ptr__->d).bd = 1;
    __return_storage_ptr__->v = pfVar1 + uVar5 * b;
    (__return_storage_ptr__->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT816(0) << 0x20,0);
    (__return_storage_ptr__->bs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT816(0) << 0x20,8);
  }
  return __return_storage_ptr__;
}

Assistant:

Tensor batch_elem(unsigned b) const {
    if(d.batch_elems() == 1) {
      return *this;
    } else {
      assert(b < d.batch_elems());
      const unsigned bsize = d.batch_size();
      Dim new_d(d); new_d.bd = 1;
      Tensor ret(new_d, v + bsize * b);
      // std::cerr << "Getting tensor for batch " << (b % d.batch_elems()) << " bsize: " << bsize << ", ptr=" << (long)ret.v << std::endl;
      return ret;
    }
  }